

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# record-replay.cpp
# Opt level: O1

void replay_term(global_state_t *g)

{
  ped_type_t pVar1;
  __cilkrts_worker *p_Var2;
  FILE *__stream;
  replay_entry_t *prVar3;
  local_state *plVar4;
  replay_entry_t *prVar5;
  long lVar6;
  
  if (g->record_replay_file_name != (char *)0x0) {
    __cilkrts_free(g->record_replay_file_name);
  }
  if (0 < g->total_workers) {
    lVar6 = 0;
    do {
      p_Var2 = g->workers[lVar6];
      __stream = (FILE *)p_Var2->l->record_replay_fptr;
      if (__stream != (FILE *)0x0) {
        fclose(__stream);
      }
      prVar3 = p_Var2->l->replay_list_root;
      if (prVar3 != (replay_entry_t *)0x0) {
        if (p_Var2->l->replay_list_entry->m_type != ped_type_last) {
          replay_term_cold_1();
        }
        pVar1 = prVar3->m_type;
        while (pVar1 != ped_type_last) {
          __cilkrts_free(prVar3->m_reverse_pedigree);
          prVar3->m_reverse_pedigree = (uint64_t *)0x0;
          prVar5 = prVar3 + 1;
          prVar3 = prVar3 + 1;
          pVar1 = prVar5->m_type;
        }
        __cilkrts_free(p_Var2->l->replay_list_root);
        plVar4 = p_Var2->l;
        plVar4->replay_list_root = (replay_entry_t *)0x0;
        plVar4->replay_list_entry = (replay_entry_t *)0x0;
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 < g->total_workers);
  }
  return;
}

Assistant:

void replay_term(global_state_t *g)
{
    // Free memory for the record/replay log file name, if we've got one
    if (g->record_replay_file_name)
        __cilkrts_free(g->record_replay_file_name);

    // Per-worker cleanup
    for(int i = 0; i < g->total_workers; ++i)
    {
        __cilkrts_worker *w = g->workers[i];

        // Close the log files, if we've opened them
        if(w->l->record_replay_fptr)
            fclose(w->l->record_replay_fptr);

        if (w->l->replay_list_root)
        {
            // We should have consumed the entire list
            CILK_ASSERT(ped_type_last == w->l->replay_list_entry->m_type);

            replay_entry_t *entry = w->l->replay_list_root;
            while (ped_type_last != entry->m_type)
            {
                // Free the pedigree memory for each entry
                entry->unload();
                entry++;
            }
            __cilkrts_free(w->l->replay_list_root);
            w->l->replay_list_root = NULL;
            w->l->replay_list_entry = NULL;
        }
    }
}